

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

uint __thiscall
embree::TutorialScene::materialID
          (TutorialScene *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  if ((material->ptr->super_Node).id == 0xffffffff) {
    std::
    vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
    ::push_back(&this->materials,material);
    (material->ptr->super_Node).id =
         (int)((ulong)((long)(this->materials).
                             super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->materials).
                            super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  }
  return (material->ptr->super_Node).id;
}

Assistant:

unsigned TutorialScene::materialID(Ref<SceneGraph::MaterialNode> material) 
  {
    if (material->id == -1) {
      materials.push_back(material);
      material->id = unsigned(materials.size()-1);
    }
    return material->id;
  }